

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::ListSceneNames
               (Prim *root,
               vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *sceneNames)

{
  Specifier SVar1;
  pointer pPVar2;
  PrimMeta *pPVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  Prim *child;
  pointer this;
  undefined1 local_58 [40];
  
  if (sceneNames ==
      (vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    return false;
  }
  pPVar3 = Prim::metas(root);
  if ((pPVar3->kind).has_value_ == true) {
    pPVar3 = Prim::metas(root);
    pvVar4 = nonstd::optional_lite::optional<tinyusdz::Kind>::value(&pPVar3->kind);
    if (*pvVar4 == SceneLibrary) {
      pPVar2 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this = (root->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start; this != pPVar2; this = this + 1) {
        pPVar3 = Prim::metas(this);
        if ((pPVar3->sceneName).has_value_ == true) {
          SVar1 = this->_specifier;
          pPVar3 = Prim::metas(this);
          pvVar5 = nonstd::optional_lite::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value(&pPVar3->sceneName);
          local_58[0] = SVar1 == Over;
          ::std::__cxx11::string::string((string *)(local_58 + 8),(string *)pvVar5);
          ::std::
          vector<std::pair<bool,std::__cxx11::string>,std::allocator<std::pair<bool,std::__cxx11::string>>>
          ::emplace_back<std::pair<bool,std::__cxx11::string>>
                    ((vector<std::pair<bool,std::__cxx11::string>,std::allocator<std::pair<bool,std::__cxx11::string>>>
                      *)sceneNames,
                     (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_58);
          ::std::__cxx11::string::_M_dispose();
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ListSceneNames(const tinyusdz::Prim &root,
                    std::vector<std::pair<bool, std::string>> *sceneNames) {
  if (!sceneNames) {
    return false;
  }

  bool has_sceneLibrary = false;
  if (root.metas().kind.has_value()) {
    if (root.metas().kind.value() == Kind::SceneLibrary) {
      // ok
      has_sceneLibrary = true;
    }
  }

  if (!has_sceneLibrary) {
    return false;
  }

  for (const Prim &child : root.children()) {
    if (!ListSceneNamesRec(child, /* depth */ 0, sceneNames)) {
      return false;
    }
  }

  return true;
}